

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserErrors
xmlParseInNodeContext(xmlNodePtr node,char *data,int datalen,int options,xmlNodePtr *listOut)

{
  _xmlDoc *p_Var1;
  xmlParserInputPtr input_00;
  xmlNodePtr pxVar2;
  xmlParserErrors local_54;
  xmlParserErrors ret;
  xmlNodePtr list;
  xmlDocPtr doc;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  xmlNodePtr *listOut_local;
  int options_local;
  int datalen_local;
  char *data_local;
  xmlNodePtr node_local;
  
  if (listOut == (xmlNodePtr *)0x0) {
    node_local._4_4_ = XML_ERR_INTERNAL_ERROR;
  }
  else {
    *listOut = (xmlNodePtr)0x0;
    if (((node == (xmlNodePtr)0x0) || (data == (char *)0x0)) || (datalen < 0)) {
      node_local._4_4_ = XML_ERR_INTERNAL_ERROR;
    }
    else {
      p_Var1 = node->doc;
      if (p_Var1 == (_xmlDoc *)0x0) {
        node_local._4_4_ = XML_ERR_INTERNAL_ERROR;
      }
      else {
        if (p_Var1->type == XML_HTML_DOCUMENT_NODE) {
          input = (xmlParserInputPtr)htmlNewParserCtxt();
        }
        else {
          input = (xmlParserInputPtr)xmlNewParserCtxt();
        }
        if (input == (xmlParserInputPtr)0x0) {
          node_local._4_4_ = XML_ERR_NO_MEMORY;
        }
        else {
          input_00 = xmlCtxtNewInputFromMemory
                               ((xmlParserCtxtPtr)input,(char *)0x0,data,(long)datalen,
                                (char *)p_Var1->encoding,XML_INPUT_BUF_STATIC);
          if (input_00 == (xmlParserInputPtr)0x0) {
            xmlFreeParserCtxt((xmlParserCtxtPtr)input);
            node_local._4_4_ = XML_ERR_NO_MEMORY;
          }
          else {
            xmlCtxtUseOptions((xmlParserCtxtPtr)input,options);
            pxVar2 = xmlCtxtParseContent((xmlParserCtxtPtr)input,input_00,node,0);
            if (pxVar2 == (xmlNodePtr)0x0) {
              local_54 = *(xmlParserErrors *)&input[1].directory;
              if (local_54 == XML_ERR_ARGUMENT) {
                local_54 = XML_ERR_INTERNAL_ERROR;
              }
            }
            else {
              local_54 = XML_ERR_OK;
              *listOut = pxVar2;
            }
            xmlFreeParserCtxt((xmlParserCtxtPtr)input);
            node_local._4_4_ = local_54;
          }
        }
      }
    }
  }
  return node_local._4_4_;
}

Assistant:

xmlParserErrors
xmlParseInNodeContext(xmlNodePtr node, const char *data, int datalen,
                      int options, xmlNodePtr *listOut) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlDocPtr doc;
    xmlNodePtr list;
    xmlParserErrors ret;

    if (listOut == NULL)
        return(XML_ERR_INTERNAL_ERROR);
    *listOut = NULL;

    if ((node == NULL) || (data == NULL) || (datalen < 0))
        return(XML_ERR_INTERNAL_ERROR);

    doc = node->doc;
    if (doc == NULL)
        return(XML_ERR_INTERNAL_ERROR);

#ifdef LIBXML_HTML_ENABLED
    if (doc->type == XML_HTML_DOCUMENT_NODE) {
        ctxt = htmlNewParserCtxt();
    }
    else
#endif
        ctxt = xmlNewParserCtxt();

    if (ctxt == NULL)
        return(XML_ERR_NO_MEMORY);

    input = xmlCtxtNewInputFromMemory(ctxt, NULL, data, datalen,
                                      (const char *) doc->encoding,
                                      XML_INPUT_BUF_STATIC);
    if (input == NULL) {
        xmlFreeParserCtxt(ctxt);
        return(XML_ERR_NO_MEMORY);
    }

    xmlCtxtUseOptions(ctxt, options);

    list = xmlCtxtParseContent(ctxt, input, node, /* hasTextDecl */ 0);

    if (list == NULL) {
        ret = ctxt->errNo;
        if (ret == XML_ERR_ARGUMENT)
            ret = XML_ERR_INTERNAL_ERROR;
    } else {
        ret = XML_ERR_OK;
        *listOut = list;
    }

    xmlFreeParserCtxt(ctxt);

    return(ret);
}